

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_4402ef::Db::parseCallOffset(Db *this)

{
  char *pcVar1;
  bool bVar2;
  StringView SVar3;
  
  pcVar1 = this->First;
  bVar2 = true;
  if (pcVar1 == this->Last) {
    return true;
  }
  if (*pcVar1 != 'h') {
    if (*pcVar1 != 'v') {
      return true;
    }
    this->First = pcVar1 + 1;
    SVar3 = parseNumber(this,true);
    if (SVar3.First == SVar3.Last) {
      return true;
    }
    pcVar1 = this->First;
    if (pcVar1 == this->Last) {
      return true;
    }
    if (*pcVar1 != '_') {
      return true;
    }
  }
  this->First = pcVar1 + 1;
  SVar3 = parseNumber(this,true);
  if (((SVar3.First != SVar3.Last) && (pcVar1 = this->First, pcVar1 != this->Last)) &&
     (*pcVar1 == '_')) {
    this->First = pcVar1 + 1;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }